

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

int lyv_data_content(lyd_node *node,int options,unres_data *unres)

{
  lys_node *parent_00;
  ly_ctx *ctx_00;
  undefined8 uVar1;
  lyd_node *plVar2;
  int iVar3;
  uint uVar4;
  lys_node *plVar5;
  bool bVar6;
  char *local_c8;
  char *local_c0;
  ly_ctx *ctx;
  char *idname;
  char *id;
  lys_iffeature *iff;
  uint local_78;
  uint uStack_74;
  uint8_t iff_size;
  uint j;
  uint i;
  lyd_node_leaf_list *leaf;
  lys_type *type;
  lys_tpdf *tpdf;
  lys_ident *ident;
  lyd_node *start;
  lyd_node *diter;
  lys_node *parent;
  lys_node *siter;
  lys_node *schema;
  unres_data *unres_local;
  int options_local;
  lyd_node *node_local;
  
  leaf = (lyd_node_leaf_list *)0x0;
  local_78 = 0;
  if (node == (lyd_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x2ad,"int lyv_data_content(struct lyd_node *, int, struct unres_data *)");
  }
  if (node->schema == (lys_node *)0x0) {
    __assert_fail("node->schema",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x2ae,"int lyv_data_content(struct lyd_node *, int, struct unres_data *)");
  }
  if (unres == (unres_data *)0x0) {
    __assert_fail("unres",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x2af,"int lyv_data_content(struct lyd_node *, int, struct unres_data *)");
  }
  parent_00 = node->schema;
  ctx_00 = parent_00->module->ctx;
  unres_local._4_4_ = options;
  if ((node->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN) {
    start = node->parent;
    while ((start != (lyd_node *)0x0 &&
           ((start->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF)) == LYS_UNKNOWN))) {
      start = start->parent;
    }
    if ((start == (lyd_node *)0x0) && ((options & 0x50U) != 0)) {
      unres_local._4_4_ = options | 0x2000;
    }
  }
  if ((node->validity & 4) != 0) {
    if ((unres_local._4_4_ & 0x2080) == 0) {
      if (((parent_00->nodetype == LYS_LIST) && ((unres_local._4_4_ & 6) == 0)) &&
         (iVar3 = lyv_keys(node), iVar3 != 0)) {
        return 1;
      }
      if ((parent_00->nodetype & (LYS_ANYDATA|LYS_LEAF|LYS_CONTAINER)) != LYS_UNKNOWN) {
        for (start = lyd_first_sibling(node); start != (lyd_node *)0x0; start = start->next) {
          if ((start->schema == parent_00) && (start != node)) {
            plVar5 = lys_parent(parent_00);
            if (plVar5 == (lys_node *)0x0) {
              local_c8 = "data tree";
            }
            else {
              if (plVar5->nodetype == LYS_EXT) {
                local_c0 = plVar5->ref;
              }
              else {
                local_c0 = plVar5->name;
              }
              local_c8 = local_c0;
            }
            ly_vlog(ctx_00,LYE_TOOMANY,LY_VLOG_LYD,node,parent_00->name,local_c8);
            return 1;
          }
        }
      }
      if ((unres_local._4_4_ & 0x800) != 0) {
        parent = node->schema;
        do {
          if (((parent->flags & 0x38) == 0x20) && ((unres_local._4_4_ & 0x800) != 0)) {
            ly_vlog(ctx_00,LYE_OBSDATA,LY_VLOG_LYD,node,parent_00->name);
            return 1;
          }
          parent = lys_parent(parent);
          bVar6 = false;
          if (parent != (lys_node *)0x0) {
            bVar6 = (parent->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CONTAINER))
                    == LYS_UNKNOWN;
          }
        } while (bVar6);
        if ((parent_00->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
          if ((unres_local._4_4_ & 0x800) != 0) {
            for (type = (lys_type *)node->schema[1].ext; type != (lys_type *)0x0;
                type = (lys_type *)type[1].ext) {
              if (((ulong)type->parent & 0x38) == 0x20) {
                uVar1._0_4_ = type->base;
                uVar1._4_1_ = type->value_flags;
                uVar1._5_1_ = type->ext_size;
                uVar1._6_2_ = *(undefined2 *)&type->field_0x6;
                ly_vlog(ctx_00,LYE_OBSTYPE,LY_VLOG_LYD,node,parent_00->name,uVar1);
                return 1;
              }
            }
          }
          if (*(int *)&node[1].schema == 7) {
            plVar2 = node->child;
            iVar3 = lyp_check_status(parent_00->flags,parent_00->module,parent_00->name,
                                     *(uint16_t *)&plVar2->next,*(lys_module **)&plVar2->hash,
                                     (char *)plVar2->schema,(lys_node *)0x0);
            if (iVar3 != 0) {
              ly_vlog(ctx_00,LYE_PATH,LY_VLOG_LYD,node);
              return 1;
            }
          }
        }
      }
    }
    if ((parent_00->flags & 0x2000) != 0) {
      iVar3 = lyv_extension(parent_00->ext,parent_00->ext_size,node);
      if (iVar3 != 0) {
        return 1;
      }
      if ((parent_00->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
        leaf = (lyd_node_leaf_list *)&parent_00[1].ref;
        iVar3 = lyv_type_extension((lyd_node_leaf_list *)node,(lys_type *)leaf,1);
        if (iVar3 != 0) {
          return 1;
        }
      }
    }
    node->validity = node->validity & 0xfb;
  }
  if ((parent_00->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN)
  {
    parent = (lys_node *)0x0;
    do {
      parent = lys_getnext(parent,parent_00,(lys_module *)0x0,0);
      if (parent == (lys_node *)0x0) break;
      if ((parent->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
        for (start = node->child; start != (lyd_node *)0x0; start = start->next) {
          if ((start->schema == parent) && ((start->validity & 1) != 0)) {
            if ((unres_local._4_4_ & 0x2006) == 0) {
              iVar3 = lyv_data_dup(start,node->child);
              if (iVar3 != 0) {
                return 1;
              }
            }
            else {
              start->validity = start->validity & 0xfe;
            }
            break;
          }
        }
      }
    } while( true );
  }
  if ((node->validity & 2) != 0) {
    if ((unres_local._4_4_ & 0x2000) == 0) {
      iVar3 = unres_data_add(unres,node,UNRES_UNIQ_LEAVES);
      if (iVar3 != 0) {
        return 1;
      }
    }
    else {
      node->validity = node->validity & 0xfd;
    }
  }
  if ((parent_00->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
    iVar3 = *(int *)&node[1].schema;
    if (iVar3 == 2) {
      idname = "Bit";
      leaf = (lyd_node_leaf_list *)find_orig_type((lys_type *)&node->schema[1].ref,LY_TYPE_BITS);
      local_78 = 0;
      goto LAB_0012bc29;
    }
    if (iVar3 == 6) {
      idname = "Enum";
      ctx = (ly_ctx *)node->ht;
      iff._7_1_ = *(byte *)((long)&node->child->next + 3);
      id = (char *)node->child->parent;
    }
    else if (iVar3 == 7) {
      idname = "Identity";
      ctx = (ly_ctx *)node->ht;
      iff._7_1_ = *(byte *)((long)&node->child->next + 3);
      id = (char *)node->child->parent;
    }
    else {
      iff._7_1_ = 0;
    }
LAB_0012bd1f:
    if (iff._7_1_ != 0) {
      for (uStack_74 = 0; uStack_74 < iff._7_1_; uStack_74 = uStack_74 + 1) {
        iVar3 = resolve_iffeature((lys_iffeature *)(id + (ulong)uStack_74 * 0x20));
        if (iVar3 == 0) {
          ly_vlog(ctx_00,LYE_INVAL,LY_VLOG_LYD,node,node->ht,parent_00->name);
          ly_vlog(ctx_00,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                  "%s \"%s\" is disabled by its if-feature condition.",idname,ctx);
          return 1;
        }
      }
      if (*(int *)&node[1].schema != 2) goto LAB_0012bde4;
      do {
        local_78 = local_78 + 1;
LAB_0012bc29:
        iff._7_1_ = 0;
        if (*(uint *)&leaf->parent <= local_78) goto LAB_0012bd1f;
      } while ((&node->child->schema)[local_78] == (lys_node *)0x0);
      ctx = (ly_ctx *)(&node->child->schema)[local_78]->name;
      iff._7_1_ = (&node->child->schema)[local_78]->iffeature_size;
      id = (char *)(&node->child->schema)[local_78]->iffeature;
      goto LAB_0012bd1f;
    }
  }
LAB_0012bde4:
  if ((unres_local._4_4_ & 0x208e) == 0) {
    uVar4 = resolve_applies_must(node);
    if (((uVar4 & 1) != 0) && (iVar3 = unres_data_add(unres,node,UNRES_MUST), iVar3 != 0)) {
      return 1;
    }
    if (((uVar4 & 2) != 0) && (iVar3 = unres_data_add(unres,node,UNRES_MUST_INOUT), iVar3 != 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int
lyv_data_content(struct lyd_node *node, int options, struct unres_data *unres)
{
    const struct lys_node *schema, *siter, *parent;
    struct lyd_node *diter, *start = NULL;
    struct lys_ident *ident;
    struct lys_tpdf *tpdf;
    struct lys_type *type = NULL;
    struct lyd_node_leaf_list *leaf;
    unsigned int i, j = 0;
    uint8_t iff_size;
    struct lys_iffeature *iff;
    const char *id, *idname;
    struct ly_ctx *ctx;

    assert(node);
    assert(node->schema);
    assert(unres);

    schema = node->schema; /* shortcut */
    ctx = schema->module->ctx;

    if (!(node->schema->nodetype & (LYS_NOTIF | LYS_RPC | LYS_ACTION))) {
        for (diter = node->parent; diter; diter = diter->parent) {
            if (diter->schema->nodetype & (LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
                break;
            }
        }
        if (!diter && (options & (LYD_OPT_NOTIF | LYD_OPT_RPC))) {
            /* validating parent of a nested notification/action, skip most checks */
            options |= LYD_OPT_TRUSTED;
        }
    }

    if (node->validity & LYD_VAL_MAND) {
        if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER))) {
            /* check presence and correct order of all keys in case of list */
            if (schema->nodetype == LYS_LIST && !(options & (LYD_OPT_GET | LYD_OPT_GETCONFIG))) {
                if (lyv_keys(node)) {
                    return 1;
                }
            }

            if (schema->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_ANYDATA)) {
                /* check number of instances (similar to list uniqueness) for non-list nodes */

                /* find duplicity */
                start = lyd_first_sibling(node);
                for (diter = start; diter; diter = diter->next) {
                    if (diter->schema == schema && diter != node) {
                        parent = lys_parent(schema);
                        LOGVAL(ctx, LYE_TOOMANY, LY_VLOG_LYD, node, schema->name,
                               parent ? (parent->nodetype == LYS_EXT) ? ((struct lys_ext_instance *)parent)->arg_value : parent->name : "data tree");
                        return 1;
                    }
                }
            }

            if (options & LYD_OPT_OBSOLETE) {
                /* status - of the node's schema node itself and all its parents that
                * cannot have their own instance (like a choice statement) */
                siter = node->schema;
                do {
                    if (((siter->flags & LYS_STATUS_MASK) == LYS_STATUS_OBSLT) && (options & LYD_OPT_OBSOLETE)) {
                        LOGVAL(ctx, LYE_OBSDATA, LY_VLOG_LYD, node, schema->name);
                        return 1;
                    }
                    siter = lys_parent(siter);
                } while (siter && !(siter->nodetype & (LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)));

                /* status of the identity value */
                if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                    if (options & LYD_OPT_OBSOLETE) {
                        /* check that we are not instantiating obsolete type */
                        tpdf = ((struct lys_node_leaf *)node->schema)->type.der;
                        while (tpdf) {
                            if ((tpdf->flags & LYS_STATUS_MASK) == LYS_STATUS_OBSLT) {
                                LOGVAL(ctx, LYE_OBSTYPE, LY_VLOG_LYD, node, schema->name, tpdf->name);
                                return 1;
                            }
                            tpdf = tpdf->type.der;
                        }
                    }
                    if (((struct lyd_node_leaf_list *)node)->value_type == LY_TYPE_IDENT) {
                        ident = ((struct lyd_node_leaf_list *)node)->value.ident;
                        if (lyp_check_status(schema->flags, schema->module, schema->name,
                                        ident->flags, ident->module, ident->name, NULL)) {
                            LOGPATH(ctx, LY_VLOG_LYD, node);
                            return 1;
                        }
                    }
                }
            }
        }

        /* check validation function for extension */
        if (schema->flags & LYS_VALID_EXT) {
            // check extension in node
            if (lyv_extension(schema->ext, schema->ext_size, node)) {
                return EXIT_FAILURE;
            }

            if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                type = &((struct lys_node_leaf *) schema)->type;
                leaf = (struct lyd_node_leaf_list *) node;
                if (lyv_type_extension(leaf, type, 1)) {
                    return EXIT_FAILURE;
                }
            }
        }

        /* remove the flag */
        node->validity &= ~LYD_VAL_MAND;
    }

    if (schema->nodetype & (LYS_LIST | LYS_CONTAINER | LYS_NOTIF | LYS_RPC | LYS_ACTION)) {
        siter = NULL;
        while ((siter = lys_getnext(siter, schema, NULL, 0))) {
            if (siter->nodetype & (LYS_LIST | LYS_LEAFLIST)) {
                LY_TREE_FOR(node->child, diter) {
                    if (diter->schema == siter && (diter->validity & LYD_VAL_DUP)) {
                        /* skip key uniqueness check in case of get/get-config data */
                        if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_GET | LYD_OPT_GETCONFIG))) {
                            if (lyv_data_dup(diter, node->child)) {
                                return 1;
                            }
                        } else {
                            /* always remove the flag */
                            diter->validity &= ~LYD_VAL_DUP;
                        }
                        /* all schema instances checked, continue with another schema node */
                        break;
                    }
                }
            }
        }
    }

    if (node->validity & LYD_VAL_UNIQUE) {
        if (options & LYD_OPT_TRUSTED) {
            /* just remove flag */
            node->validity &= ~LYD_VAL_UNIQUE;
        } else {
            /* check the unique constraint at the end (once the parsing is done) */
            if (unres_data_add(unres, node, UNRES_UNIQ_LEAVES)) {
                return 1;
            }
        }
    }

    if (schema->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
        /* since feature can be enabled/disabled, do this check despite the validity flag,
         * - check if the type value (enum, bit, identity) is disabled via feature  */
        leaf = (struct lyd_node_leaf_list *)node;
        switch (leaf->value_type) {
        case LY_TYPE_BITS:
            id = "Bit";
            /* get the count of bits */
            type = find_orig_type(&((struct lys_node_leaf *)leaf->schema)->type, LY_TYPE_BITS);
            for (j = iff_size = 0; j < type->info.bits.count; j++) {
                if (!leaf->value.bit[j]) {
                    continue;
                }
                idname = leaf->value.bit[j]->name;
                iff_size = leaf->value.bit[j]->iffeature_size;
                iff = leaf->value.bit[j]->iffeature;
                break;
nextbit:
                iff_size = 0;
            }
            break;
        case LY_TYPE_ENUM:
            id = "Enum";
            idname = leaf->value_str;
            iff_size = leaf->value.enm->iffeature_size;
            iff = leaf->value.enm->iffeature;
            break;
        case LY_TYPE_IDENT:
            id = "Identity";
            idname = leaf->value_str;
            iff_size = leaf->value.ident->iffeature_size;
            iff = leaf->value.ident->iffeature;
            break;
        default:
            iff_size = 0;
            break;
        }

        if (iff_size) {
            for (i = 0; i < iff_size; i++) {
                if (!resolve_iffeature(&iff[i])) {
                    LOGVAL(ctx, LYE_INVAL, LY_VLOG_LYD, node, leaf->value_str, schema->name);
                    LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "%s \"%s\" is disabled by its if-feature condition.",
                           id, idname);
                    return 1;
                }
            }
            if (leaf->value_type == LY_TYPE_BITS) {
                goto nextbit;
            }
        }
    }

    /* check must conditions */
    if (!(options & (LYD_OPT_TRUSTED | LYD_OPT_NOTIF_FILTER | LYD_OPT_EDIT | LYD_OPT_GET | LYD_OPT_GETCONFIG))) {
        i = resolve_applies_must(node);
        if ((i & 0x1) && unres_data_add(unres, node, UNRES_MUST)) {
            return 1;
        }
        if ((i & 0x2) && unres_data_add(unres, node, UNRES_MUST_INOUT)) {
            return 1;
        }
    }

    return 0;
}